

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O1

bit_array_impl * __thiscall
baryonyx::bit_array_impl::operator=(bit_array_impl *this,bit_array_impl *other)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long *__s;
  ulong __n;
  
  if (this != other) {
    if ((this->m_size != other->m_size) || (this->m_block_size != other->m_block_size)) {
      this->m_size = other->m_size;
      iVar1 = other->m_block_size;
      this->m_block_size = iVar1;
      __n = 0xffffffffffffffff;
      if (-1 < (long)iVar1) {
        __n = (long)iVar1 * 8;
      }
      __s = (unsigned_long *)operator_new__(__n);
      memset(__s,0,__n);
      puVar2 = (this->m_data)._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (this->m_data)._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = __s;
      if (puVar2 != (unsigned_long *)0x0) {
        operator_delete__(puVar2);
      }
    }
    if (0 < (long)this->m_block_size) {
      memmove((this->m_data)._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
              (other->m_data)._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
              (long)this->m_block_size << 3);
    }
  }
  return this;
}

Assistant:

bit_array_impl& operator=(const bit_array_impl& other)
    {
        if (this != &other) {
            if (!(m_size == other.m_size &&
                  m_block_size == other.m_block_size)) {
                m_size = other.m_size;
                m_block_size = other.m_block_size;
                m_data = std::make_unique<underlying_type[]>(m_block_size);
            }
            std::copy_n(other.m_data.get(), m_block_size, m_data.get());
        }

        return *this;
    }